

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

ssize_t __thiscall just::file::write(file *this,int __fd,void *__buf,size_t __n)

{
  int __fd_00;
  void *__buf_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  output_file local_40;
  undefined8 local_18;
  string *content__local;
  string *filename__local;
  
  local_18 = CONCAT44(in_register_00000034,__fd);
  content__local = (string *)this;
  impl::output_file::output_file(&local_40,(string *)this);
  __fd_00 = std::__cxx11::string::c_str();
  __buf_00 = (void *)std::__cxx11::string::size();
  impl::output_file::write(&local_40,__fd_00,__buf_00,__n);
  impl::output_file::~output_file(&local_40);
  return extraout_RAX;
}

Assistant:

inline void write(const std::string& filename_, const std::string& content_)
    {
      impl::output_file(filename_).write(content_.c_str(), content_.size());
    }